

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O0

void * mpp_enc_thread(void *data)

{
  MppEncImpl *enc_00;
  MppThreadStatus MVar1;
  MPP_RET MVar2;
  RK_S64 RVar3;
  Mutex *pMVar4;
  undefined1 local_2b0 [8];
  AutoMutex autolock_1;
  AutoMutex autolock_2;
  undefined1 local_288 [8];
  AutoMutex autolock;
  MPP_RET ret;
  EncAsyncStatus *status;
  undefined1 local_260 [4];
  EncAsyncWait wait;
  EncAsyncTaskInfo task;
  MppThread *thd_enc;
  MppEncImpl *enc;
  Mpp *mpp;
  void *data_local;
  
  enc_00 = *(MppEncImpl **)((long)data + 0xb0);
  task.usr._24_8_ = enc_00->thread_enc;
  autolock.mLock._4_4_ = MPP_OK;
  memset(local_260,0,0x238);
  status._4_4_ = 0;
  RVar3 = mpp_time();
  enc_00->time_base = RVar3;
  do {
    while( true ) {
      pMVar4 = MppThread::mutex((MppThread *)task.usr._24_8_,THREAD_WORK);
      Mutex::Autolock::Autolock((Autolock *)local_288,pMVar4,1);
      MVar1 = MppThread::get_status((MppThread *)task.usr._24_8_,THREAD_WORK);
      if (MVar1 == MPP_THREAD_RUNNING) {
        MVar2 = check_enc_task_wait(enc_00,(EncAsyncWait *)((long)&status + 4));
        if (MVar2 != MPP_OK) {
          MppThread::wait((MppThread *)task.usr._24_8_,(void *)0x0);
        }
        autolock_2.mLock._4_4_ = 0;
      }
      else {
        autolock_2.mLock._4_4_ = 3;
      }
      Mutex::Autolock::~Autolock((Autolock *)local_288);
      if (autolock_2.mLock._4_4_ != 0) {
        release_task_in_port(enc_00->input);
        release_task_in_port(*(MppPort *)((long)data + 0x58));
        return (void *)0x0;
      }
      if ((wait.val >> 8 & 1) == 0) break;
LAB_00142ea7:
      if (((wait.val >> 8 & 1) == 0) &&
         (_mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"status->enc_start",
                     "mpp_enc_thread",0xa89), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      if ((wait.val >> 8 & 1) != 0) {
        if (enc_00->low_delay_part_mode == 0) {
          try_proc_normal_task(enc_00,(EncAsyncTaskInfo *)local_260);
        }
        else {
          try_proc_low_deley_task
                    ((Mpp *)data,(EncAsyncTaskInfo *)local_260,(EncAsyncWait *)((long)&status + 4));
        }
      }
    }
    if (enc_00->cmd_send == enc_00->cmd_recv) {
      if (enc_00->reset_flag == 0) {
        autolock.mLock._4_4_ =
             try_get_enc_task(enc_00,(EncAsyncTaskInfo *)local_260,
                              (EncAsyncWait *)((long)&status + 4));
        if (autolock.mLock._4_4_ == MPP_OK) goto LAB_00142ea7;
      }
      else {
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","thread reset start\n","mpp_enc_thread");
        }
        pMVar4 = MppThread::mutex((MppThread *)task.usr._24_8_,THREAD_WORK);
        Mutex::Autolock::Autolock((Autolock *)&autolock_1.mLock,pMVar4,1);
        enc_00->status_flag = 0;
        Mutex::Autolock::~Autolock((Autolock *)&autolock_1.mLock);
        (enc_00->frm_cfg).force_flag = (enc_00->frm_cfg).force_flag | 1;
        (enc_00->frm_cfg).force_idr = (enc_00->frm_cfg).force_idr + 1;
        pMVar4 = MppThread::mutex((MppThread *)task.usr._24_8_,THREAD_CONTROL);
        Mutex::Autolock::Autolock((Autolock *)local_2b0,pMVar4,1);
        enc_00->reset_flag = 0;
        sem_post((sem_t *)&enc_00->enc_reset);
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","thread reset done\n","mpp_enc_thread");
        }
        status._4_4_ = 0;
        Mutex::Autolock::~Autolock((Autolock *)local_2b0);
      }
    }
    else {
      if ((mpp_enc_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_enc","ctrl proc %d cmd %08x\n","mpp_enc_thread",(ulong)enc_00->cmd_recv,
                   (ulong)enc_00->cmd);
      }
      sem_wait((sem_t *)&enc_00->cmd_start);
      autolock.mLock._4_4_ = mpp_enc_proc_cfg(enc_00,enc_00->cmd,enc_00->param);
      if (autolock.mLock._4_4_ != MPP_OK) {
        *enc_00->cmd_ret = autolock.mLock._4_4_;
      }
      enc_00->cmd_recv = enc_00->cmd_recv + 1;
      if ((mpp_enc_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_enc","ctrl proc %d done send %d\n","mpp_enc_thread",
                   (ulong)enc_00->cmd_recv,(ulong)enc_00->cmd_send);
      }
      if ((enc_00->cmd_send != enc_00->cmd_send) &&
         (_mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "enc->cmd_send == enc->cmd_send","mpp_enc_thread",0xa61),
         (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      enc_00->param = (void *)0x0;
      enc_00->cmd = 0;
      sem_post((sem_t *)&enc_00->cmd_done);
      mpp_enc_hal_prepare(enc_00->enc_hal);
      mpp_enc_proc_rc_update(enc_00);
      status._4_4_ = 0;
    }
  } while( true );
}

Assistant:

void *mpp_enc_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppEncImpl *enc = (MppEncImpl *)mpp->mEnc;
    MppThread *thd_enc  = enc->thread_enc;
    EncAsyncTaskInfo task;
    EncAsyncWait wait;
    EncAsyncStatus *status = &task.status;
    MPP_RET ret = MPP_OK;

    memset(&task, 0, sizeof(task));
    wait.val = 0;

    enc->time_base = mpp_time();

    while (1) {
        {
            AutoMutex autolock(thd_enc->mutex());
            if (MPP_THREAD_RUNNING != thd_enc->get_status())
                break;

            if (check_enc_task_wait(enc, &wait))
                thd_enc->wait();
        }

        // When encoder is not on encoding process external config and reset
        if (!status->enc_start) {
            // 1. process user control
            if (enc->cmd_send != enc->cmd_recv) {
                enc_dbg_detail("ctrl proc %d cmd %08x\n", enc->cmd_recv, enc->cmd);
                sem_wait(&enc->cmd_start);
                ret = mpp_enc_proc_cfg(enc, enc->cmd, enc->param);
                if (ret)
                    *enc->cmd_ret = ret;
                enc->cmd_recv++;
                enc_dbg_detail("ctrl proc %d done send %d\n", enc->cmd_recv,
                               enc->cmd_send);
                mpp_assert(enc->cmd_send == enc->cmd_send);
                enc->param = NULL;
                enc->cmd = (MpiCmd)0;
                sem_post(&enc->cmd_done);

                // async cfg update process for hal
                // mainly for buffer prepare
                mpp_enc_hal_prepare(enc->enc_hal);

                /* NOTE: here will clear change flag of rc and prep cfg */
                mpp_enc_proc_rc_update(enc);
                wait.val = 0;
                continue;
            }

            // 2. process reset
            if (enc->reset_flag) {
                enc_dbg_detail("thread reset start\n");
                {
                    AutoMutex autolock(thd_enc->mutex());
                    enc->status_flag = 0;
                }

                enc->frm_cfg.force_flag |= ENC_FORCE_IDR;
                enc->frm_cfg.force_idr++;

                AutoMutex autolock(thd_enc->mutex(THREAD_CONTROL));
                enc->reset_flag = 0;
                sem_post(&enc->enc_reset);
                enc_dbg_detail("thread reset done\n");
                wait.val = 0;
                continue;
            }

            // 3. try get a task to encode
            ret = try_get_enc_task(enc, &task, &wait);
            if (ret)
                continue;
        }

        mpp_assert(status->enc_start);
        if (!status->enc_start)
            continue;

        // check partition low delay encoding
        /*
         * NOTE: Only when both split encoding and low delay mode are set then
         *       use special low delay path
         */
        if (enc->low_delay_part_mode)
            try_proc_low_deley_task(mpp, &task, &wait);
        else
            try_proc_normal_task(enc, &task);
    }

    // clear remain task in enc->output port
    release_task_in_port(enc->input);
    release_task_in_port(mpp->mUsrOutPort);

    return NULL;
}